

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O0

void tqapi_tapi_free_query_balance_result(TradeApi *tapi,QueryBalanceResult *result)

{
  QueryBalanceResultData *this;
  QueryBalanceResult *result_local;
  TradeApi *tapi_local;
  
  this = result->_data;
  if (this != (QueryBalanceResultData *)0x0) {
    QueryBalanceResultData::~QueryBalanceResultData(this);
    operator_delete(this);
  }
  if (result != (QueryBalanceResult *)0x0) {
    operator_delete(result);
  }
  return;
}

Assistant:

void tqapi_tapi_free_query_balance_result (TradeApi* tapi, QueryBalanceResult  * result)
    {
        delete result->_data;
        delete result;
    }